

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_file_dtype_parse(char *buffer,char *dtype,void *data,char *fmt)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char ndtype [8];
  char ndtype2 [8];
  char converted [128];
  
  _dtype_normalize(ndtype2,dtype);
  ndtype2[0] = '=';
  _dtype_normalize(ndtype,ndtype2);
  pcVar3 = ndtype + 1;
  iVar1 = bcmp(pcVar3,"a1",3);
  if (iVar1 == 0) {
    pcVar3 = "%c";
  }
  else {
    iVar1 = bcmp(pcVar3,"i8",3);
    if (iVar1 == 0) {
      pcVar3 = "%ld";
    }
    else {
      iVar1 = bcmp(pcVar3,"i4",3);
      if (iVar1 == 0) {
        pcVar3 = "%d";
      }
      else {
        iVar1 = bcmp(pcVar3,"u8",3);
        if (iVar1 == 0) {
          pcVar3 = "%lu";
        }
        else {
          iVar1 = bcmp(pcVar3,"u4",3);
          if (iVar1 == 0) {
            pcVar3 = "%u";
          }
          else {
            iVar1 = bcmp(pcVar3,"f8",3);
            if (iVar1 == 0) {
              pcVar3 = "%lf";
            }
            else {
              iVar1 = bcmp(pcVar3,"f4",3);
              if (iVar1 != 0) {
                iVar1 = bcmp(pcVar3,"c8",3);
                if (iVar1 == 0) {
                  pcVar3 = "%f + %f I";
                  if (fmt != (char *)0x0) {
                    pcVar3 = fmt;
                  }
                  pcVar2 = converted + 4;
                }
                else {
                  if (ndtype._1_4_ != 0x363163) {
                    return -1;
                  }
                  pcVar3 = "%lf + %lf I";
                  if (fmt != (char *)0x0) {
                    pcVar3 = fmt;
                  }
                  pcVar2 = converted + 8;
                }
                __isoc99_sscanf(buffer,pcVar3,converted,pcVar2);
                goto LAB_00106776;
              }
              pcVar3 = "%f";
            }
          }
        }
      }
    }
  }
  if (fmt != (char *)0x0) {
    pcVar3 = fmt;
  }
  __isoc99_sscanf(buffer,pcVar3,converted);
LAB_00106776:
  dtype_convert_simple(data,dtype,converted,ndtype,1);
  return 0;
}

Assistant:

int
big_file_dtype_parse(const char * buffer, const char * dtype, void * data, const char * fmt)
{
    char ndtype[8];
    char ndtype2[8];
    variant_t p;

    /* handle the endianness stuff in case it is not machine */
    char converted[128];

    _dtype_normalize(ndtype2, dtype);
    ndtype2[0] = '=';
    _dtype_normalize(ndtype, ndtype2);

    p.v = converted;
#define PARSE1(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sscanf(buffer, fmt, p.dtype); \
    }
#define PARSE2(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sscanf(buffer, fmt, &p.dtype->r, &p.dtype->i); \
    }
    PARSE1(a1, "%c") else
    PARSE1(i8, "%ld") else
    PARSE1(i4, "%d") else
    PARSE1(u8, "%lu") else
    PARSE1(u4, "%u") else
    PARSE1(f8, "%lf") else
    PARSE1(f4, "%f") else
    PARSE2(c8, "%f + %f I") else
    PARSE2(c16, "%lf + %lf I") else
    return -1;

    dtype_convert_simple(data, dtype, converted, ndtype, 1);

    return 0;
}